

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O0

void __thiscall
swrenderer::DrawFuzzColumnPalCommand::Execute(DrawFuzzColumnPalCommand *this,DrawerThread *thread)

{
  bool bVar1;
  BYTE *pBVar2;
  int first_line;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint8_t *srcdest_2;
  uint8_t *srcdest_1;
  int cnt;
  int next_wrap;
  int available;
  bool lowerbounds;
  uint8_t *srcdest;
  int fuzz;
  int fuzzstep;
  int pitch;
  uint8_t *dest;
  uint8_t *map;
  int count;
  int yh;
  int yl;
  DrawerThread *thread_local;
  DrawFuzzColumnPalCommand *this_local;
  
  first_line = MAX<int>(*(int *)&(this->super_DrawerCommand).field_0xc,1);
  iVar3 = MIN<int>(this->_yh,this->_fuzzviewheight);
  map._4_4_ = DrawerThread::count_for_thread(thread,first_line,(iVar3 - first_line) + 1);
  pBVar2 = NormalLight.Maps;
  if (0 < map._4_4_) {
    _fuzzstep = DrawerThread::dest_for_thread<unsigned_char>
                          (thread,first_line,this->_pitch,
                           this->_destorg + (*(int *)(ylookup + (long)first_line * 4) + this->_x));
    iVar6 = this->_pitch * thread->num_cores;
    iVar3 = thread->num_cores;
    iVar5 = this->_fuzzpos;
    iVar4 = DrawerThread::skipped_by_thread(thread,first_line);
    srcdest._4_4_ = (iVar5 + iVar4) % 0x32;
    iVar5 = DrawerThread::skipped_by_thread(thread,first_line);
    if (iVar5 + first_line < iVar3) {
      *_fuzzstep = pBVar2[(ulong)_fuzzstep[(long)iVar6 +
                                           (long)(*(int *)(fuzzoffset + (long)srcdest._4_4_ * 4) *
                                                 iVar3)] + 0x600];
      _fuzzstep = _fuzzstep + iVar6;
      srcdest._4_4_ = (iVar3 + srcdest._4_4_) % 0x32;
      map._4_4_ = map._4_4_ + -1;
      if (map._4_4_ == 0) {
        return;
      }
    }
    bVar1 = this->_fuzzviewheight < iVar5 + first_line + (map._4_4_ + iVar3 + -1) * iVar3;
    if (bVar1) {
      map._4_4_ = map._4_4_ + -1;
    }
    while (0 < map._4_4_) {
      srcdest_1._4_4_ = (0x32 - srcdest._4_4_) / iVar3;
      if ((0x32 - srcdest._4_4_) % iVar3 != 0) {
        srcdest_1._4_4_ = srcdest_1._4_4_ + 1;
      }
      srcdest_1._0_4_ = MIN<int>(map._4_4_,srcdest_1._4_4_);
      map._4_4_ = map._4_4_ - (int)srcdest_1;
      do {
        *_fuzzstep = pBVar2[(ulong)_fuzzstep[*(int *)(fuzzoffset + (long)srcdest._4_4_ * 4) * iVar3]
                            + 0x600];
        _fuzzstep = _fuzzstep + iVar6;
        srcdest._4_4_ = iVar3 + srcdest._4_4_;
        srcdest_1._0_4_ = (int)srcdest_1 + -1;
      } while ((int)srcdest_1 != 0);
      srcdest._4_4_ = srcdest._4_4_ % 0x32;
    }
    if (bVar1) {
      *_fuzzstep = pBVar2[(ulong)_fuzzstep[(long)(*(int *)(fuzzoffset + (long)srcdest._4_4_ * 4) *
                                                 iVar3) - (long)iVar6] + 0x600];
    }
  }
  return;
}

Assistant:

void DrawFuzzColumnPalCommand::Execute(DrawerThread *thread)
	{
		int yl = MAX(_yl, 1);
		int yh = MIN(_yh, _fuzzviewheight);

		int count = thread->count_for_thread(yl, yh - yl + 1);

		// Zero length.
		if (count <= 0)
			return;

		uint8_t *map = &NormalLight.Maps[6 * 256];

		uint8_t *dest = thread->dest_for_thread(yl, _pitch, ylookup[yl] + _x + _destorg);

		int pitch = _pitch * thread->num_cores;
		int fuzzstep = thread->num_cores;
		int fuzz = (_fuzzpos + thread->skipped_by_thread(yl)) % FUZZTABLE;

		yl += thread->skipped_by_thread(yl);

		// Handle the case where we would go out of bounds at the top:
		if (yl < fuzzstep)
		{
			uint8_t *srcdest = dest + fuzzoffset[fuzz] * fuzzstep + pitch;
			//assert(static_cast<int>((srcdest - (uint8_t*)dc_destorg) / (_pitch)) < viewheight);

			*dest = map[*srcdest];
			dest += pitch;
			fuzz += fuzzstep;
			fuzz %= FUZZTABLE;

			count--;
			if (count == 0)
				return;
		}

		bool lowerbounds = (yl + (count + fuzzstep - 1) * fuzzstep > _fuzzviewheight);
		if (lowerbounds)
			count--;

		// Fuzz where fuzzoffset stays within bounds
		while (count > 0)
		{
			int available = (FUZZTABLE - fuzz);
			int next_wrap = available / fuzzstep;
			if (available % fuzzstep != 0)
				next_wrap++;

			int cnt = MIN(count, next_wrap);
			count -= cnt;
			do
			{
				uint8_t *srcdest = dest + fuzzoffset[fuzz] * fuzzstep;
				//assert(static_cast<int>((srcdest - (uint8_t*)dc_destorg) / (_pitch)) < viewheight);

				*dest = map[*srcdest];
				dest += pitch;
				fuzz += fuzzstep;
			} while (--cnt);

			fuzz %= FUZZTABLE;
		}

		// Handle the case where we would go out of bounds at the bottom
		if (lowerbounds)
		{
			uint8_t *srcdest = dest + fuzzoffset[fuzz] * fuzzstep - pitch;
			//assert(static_cast<int>((srcdest - (uint8_t*)dc_destorg) / (_pitch)) < viewheight);

			*dest = map[*srcdest];
		}
	}